

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O0

SeqEntry * __thiscall
ECdecoding::checkCandidate(ECdecoding *this,SeqEntry *can,unsigned_long threshold)

{
  SeqEntry *pSVar1;
  iterator __first;
  iterator __last;
  SeqEntry *in_RCX;
  value_type *in_RSI;
  SeqEntry *in_RDI;
  SeqEntry *bestCan;
  SeqEntry *pSVar2;
  vector<SeqEntry,_std::allocator<SeqEntry>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<SeqEntry_*,_std::vector<SeqEntry,_std::allocator<SeqEntry>_>_> local_30;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined1 uVar3;
  
  pSVar2 = in_RDI;
  std::vector<SeqEntry,_std::allocator<SeqEntry>_>::push_back(in_stack_ffffffffffffffc0,in_RSI);
  pSVar1 = (SeqEntry *)
           std::vector<SeqEntry,_std::allocator<SeqEntry>_>::size
                     ((vector<SeqEntry,_std::allocator<SeqEntry>_> *)
                      &(in_RSI->freq).super_ProbabilityEval.seq);
  if (in_RCX < pSVar1) {
    uVar3 = 0;
    __first = std::vector<SeqEntry,_std::allocator<SeqEntry>_>::begin(in_RDI);
    __last = std::vector<SeqEntry,_std::allocator<SeqEntry>_>::end(in_RDI);
    local_30 = std::
               min_element<__gnu_cxx::__normal_iterator<SeqEntry*,std::vector<SeqEntry,std::allocator<SeqEntry>>>>
                         (__first._M_current,__last._M_current);
    __gnu_cxx::__normal_iterator<SeqEntry_*,_std::vector<SeqEntry,_std::allocator<SeqEntry>_>_>::
    operator*(&local_30);
    SeqEntry::SeqEntry(in_RCX,(SeqEntry *)CONCAT17(uVar3,in_stack_ffffffffffffffd8));
  }
  else {
    *(undefined1 *)&(in_RSI->ac).super_acBase.mask = 1;
    SeqEntry::SeqEntry(in_RCX,(SeqEntry *)
                              CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  }
  return pSVar2;
}

Assistant:

SeqEntry ECdecoding::checkCandidate(SeqEntry &can, unsigned long threshold) {
    candidates.push_back(can);
    if (candidates.size() > threshold) {
        SeqEntry bestCan = *min_element(candidates.begin(), candidates.end());
        DEBUG("Final candidate: " << bestCan.seq);
        return bestCan;
    } else {
        endFailed = true;
        return can;
    }
}